

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::mouseReleaseEvent(QMdiSubWindow *this,QMouseEvent *mouseEvent)

{
  int iVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  Operation OVar7;
  SubControl SVar8;
  int iVar9;
  long in_FS_OFFSET;
  QPointF QVar10;
  QPointF local_50;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QWidget::mouseReleaseEvent(&this->super_QWidget,mouseEvent);
      return;
    }
  }
  else {
    if (*(int *)(mouseEvent + 0x40) == 1) {
      if (this_00->currentOperation != None) {
        if ((this_00->isInRubberBandMode == true) && (this_00->isInInteractiveMode == false)) {
          QMdiSubWindowPrivate::leaveRubberBandMode(this_00);
        }
        if ((this_00->resizeEnabled != false) || (this_00->moveEnabled == true)) {
          pQVar3 = (this->super_QWidget).data;
          RVar4.m_i = (pQVar3->crect).y1.m_i;
          RVar5.m_i = (pQVar3->crect).x2.m_i;
          RVar6.m_i = (pQVar3->crect).y2.m_i;
          (this_00->oldGeometry).x1 = (Representation)(pQVar3->crect).x1.m_i;
          (this_00->oldGeometry).y1 = (Representation)RVar4.m_i;
          (this_00->oldGeometry).x2 = (Representation)RVar5.m_i;
          (this_00->oldGeometry).y2 = (Representation)RVar6.m_i;
        }
      }
      QVar10 = QSinglePointEvent::position((QSinglePointEvent *)mouseEvent);
      local_50.yp = QVar10.yp;
      local_50.xp = QVar10.xp;
      local_40 = QPointF::toPoint(&local_50);
      OVar7 = QMdiSubWindowPrivate::getOperation(this_00,&local_40);
      this_00->currentOperation = OVar7;
      QMdiSubWindowPrivate::updateCursor(this_00);
      QVar10 = QSinglePointEvent::position((QSinglePointEvent *)mouseEvent);
      local_50.yp = QVar10.yp;
      local_50.xp = QVar10.xp;
      local_40 = QPointF::toPoint(&local_50);
      SVar8 = QMdiSubWindowPrivate::getSubControl(this_00,&local_40);
      this_00->hoveredSubControl = SVar8;
      if (this_00->activeSubControl == SVar8 && this_00->activeSubControl != SC_None) {
        QMdiSubWindowPrivate::processClickedSubControl(this_00);
      }
      this_00->activeSubControl = SC_None;
      pQVar3 = (this->super_QWidget).data;
      iVar1 = (pQVar3->crect).x2.m_i;
      iVar2 = (pQVar3->crect).x1.m_i;
      iVar9 = QMdiSubWindowPrivate::titleBarHeight(this_00);
      QRegion::QRegion((QRegion *)&local_50,0,0,(iVar1 - iVar2) + 1,iVar9,Rectangle);
      QWidget::update(&this->super_QWidget,(QRegion *)&local_50);
      QRegion::~QRegion((QRegion *)&local_50);
    }
    else {
      mouseEvent[0xc] = (QMouseEvent)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::mouseReleaseEvent(QMouseEvent *mouseEvent)
{
    if (!parent()) {
        QWidget::mouseReleaseEvent(mouseEvent);
        return;
    }

    if (mouseEvent->button() != Qt::LeftButton) {
        mouseEvent->ignore();
        return;
    }

    Q_D(QMdiSubWindow);
    if (d->currentOperation != QMdiSubWindowPrivate::None) {
#if QT_CONFIG(rubberband)
        if (d->isInRubberBandMode && !d->isInInteractiveMode)
            d->leaveRubberBandMode();
#endif
        if (d->resizeEnabled || d->moveEnabled)
            d->oldGeometry = geometry();
    }

    d->currentOperation = d->getOperation(mouseEvent->position().toPoint());
    d->updateCursor();

    d->hoveredSubControl = d->getSubControl(mouseEvent->position().toPoint());
    if (d->activeSubControl != QStyle::SC_None
            && d->activeSubControl == d->hoveredSubControl) {
        d->processClickedSubControl();
    }
    d->activeSubControl = QStyle::SC_None;
    update(QRegion(0, 0, width(), d->titleBarHeight()));
}